

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int is_transfer)

{
  int iVar1;
  size_t sVar2;
  Curl_cwriter *pCVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  bool local_5b;
  Curl_cwriter *local_58;
  Curl_cwriter *writer;
  Curl_cwtype *cwt;
  char *pcStack_40;
  _Bool is_chunked;
  size_t namelen;
  char *name;
  Curl_cwriter_phase local_28;
  CURLcode result;
  Curl_cwriter_phase phase;
  int is_transfer_local;
  char *enclist_local;
  Curl_easy *data_local;
  
  local_28 = CURL_CW_CONTENT_DECODE;
  result = is_transfer;
  _phase = enclist;
  enclist_local = (char *)data;
  if (is_transfer != 0) {
    local_28 = CURL_CW_TRANSFER_DECODE;
  }
  do {
    cwt._7_1_ = 0;
    while( true ) {
      pcVar5 = _phase;
      bVar6 = true;
      if ((*_phase != ' ') && (bVar6 = true, *_phase != '\t')) {
        bVar6 = *_phase == ',';
      }
      if (!bVar6) break;
      _phase = _phase + 1;
    }
    namelen = (size_t)_phase;
    pcStack_40 = (char *)0x0;
    while( true ) {
      bVar6 = false;
      if (*_phase != '\0') {
        bVar6 = *_phase != ',';
      }
      if (!bVar6) break;
      if (((*_phase != ' ') && (*_phase != '\t')) && ((*_phase < '\n' || ('\r' < *_phase)))) {
        pcStack_40 = _phase + (1 - (long)pcVar5);
      }
      _phase = _phase + 1;
    }
    if (pcStack_40 != (char *)0x0) {
      if ((((enclist_local != (char *)0x0) && ((*(ulong *)(enclist_local + 0xa9a) >> 0x1c & 1) != 0)
           ) && ((*(long *)(enclist_local + 0x1328) == 0 ||
                 (0 < *(int *)(*(long *)(enclist_local + 0x1328) + 8))))) &&
         (0 < Curl_trc_feat_write.log_level)) {
        pcVar4 = "content";
        if (result != CURLE_OK) {
          pcVar4 = "transfer";
        }
        Curl_trc_write((Curl_easy *)enclist_local,"looking for %s decoder: %.*s",pcVar4,
                       (ulong)pcStack_40 & 0xffffffff,pcVar5);
      }
      local_5b = false;
      if ((result != CURLE_OK) && (local_5b = false, pcStack_40 == (char *)0x7)) {
        iVar1 = curl_strnequal((char *)namelen,"chunked",7);
        local_5b = iVar1 != 0;
      }
      cwt._7_1_ = local_5b;
      if ((((result != CURLE_OK) && ((*(ulong *)(enclist_local + 0xa9a) >> 0x16 & 1) == 0)) &&
          (local_5b == false)) ||
         ((result == CURLE_OK && ((*(ulong *)(enclist_local + 0xa9a) >> 0x23 & 1) != 0)))) {
        if (((enclist_local != (char *)0x0) &&
            ((*(ulong *)(enclist_local + 0xa9a) >> 0x1c & 1) != 0)) &&
           (((*(long *)(enclist_local + 0x1328) == 0 ||
             (0 < *(int *)(*(long *)(enclist_local + 0x1328) + 8))) &&
            (0 < Curl_trc_feat_write.log_level)))) {
          Curl_trc_write((Curl_easy *)enclist_local,"decoder not requested, ignored: %.*s",
                         (ulong)pcStack_40 & 0xffffffff,namelen);
        }
        return CURLE_OK;
      }
      sVar2 = Curl_cwriter_count((Curl_easy *)enclist_local,local_28);
      if (4 < sVar2 + 1) {
        Curl_failf((Curl_easy *)enclist_local,
                   "Reject response due to more than %u content encodings",5);
        return CURLE_BAD_CONTENT_ENCODING;
      }
      writer = (Curl_cwriter *)find_unencode_writer((char *)namelen,(size_t)pcStack_40,local_28);
      if ((((Curl_cwtype *)writer != (Curl_cwtype *)0x0) && ((cwt._7_1_ & 1) != 0)) &&
         (pCVar3 = Curl_cwriter_get_by_type((Curl_easy *)enclist_local,(Curl_cwtype *)writer),
         pCVar3 != (Curl_cwriter *)0x0)) {
        if ((((enclist_local != (char *)0x0) &&
             ((*(ulong *)(enclist_local + 0xa9a) >> 0x1c & 1) != 0)) &&
            ((*(long *)(enclist_local + 0x1328) == 0 ||
             (0 < *(int *)(*(long *)(enclist_local + 0x1328) + 8))))) &&
           (0 < Curl_trc_feat_write.log_level)) {
          Curl_trc_write((Curl_easy *)enclist_local,"ignoring duplicate \'chunked\' decoder");
        }
        return CURLE_OK;
      }
      if (((result != CURLE_OK) && ((cwt._7_1_ & 1) == 0)) &&
         (pCVar3 = Curl_cwriter_get_by_name((Curl_easy *)enclist_local,"chunked"),
         pCVar3 != (Curl_cwriter *)0x0)) {
        Curl_failf((Curl_easy *)enclist_local,
                   "Reject response due to \'chunked\' not being the last Transfer-Encoding");
        return CURLE_BAD_CONTENT_ENCODING;
      }
      if (writer == (Curl_cwriter *)0x0) {
        writer = (Curl_cwriter *)&error_writer;
      }
      name._4_4_ = Curl_cwriter_create(&local_58,(Curl_easy *)enclist_local,(Curl_cwtype *)writer,
                                       local_28);
      if ((((enclist_local != (char *)0x0) && ((*(ulong *)(enclist_local + 0xa9a) >> 0x1c & 1) != 0)
           ) && ((*(long *)(enclist_local + 0x1328) == 0 ||
                 (0 < *(int *)(*(long *)(enclist_local + 0x1328) + 8))))) &&
         (0 < Curl_trc_feat_write.log_level)) {
        pcVar5 = "content";
        if (result != CURLE_OK) {
          pcVar5 = "transfer";
        }
        Curl_trc_write((Curl_easy *)enclist_local,"added %s decoder %s -> %d",pcVar5,writer->cwt,
                       (ulong)name._4_4_);
      }
      if (name._4_4_ != CURLE_OK) {
        return name._4_4_;
      }
      name._4_4_ = Curl_cwriter_add((Curl_easy *)enclist_local,local_58);
      if (name._4_4_ != CURLE_OK) {
        Curl_cwriter_free((Curl_easy *)enclist_local,local_58);
        return name._4_4_;
      }
      name._4_4_ = 0;
    }
    if (*_phase == '\0') {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int is_transfer)
{
  Curl_cwriter_phase phase = is_transfer ?
    CURL_CW_TRANSFER_DECODE : CURL_CW_CONTENT_DECODE;
  CURLcode result;

  do {
    const char *name;
    size_t namelen;
    bool is_chunked = FALSE;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    if(namelen) {
      const struct Curl_cwtype *cwt;
      struct Curl_cwriter *writer;

      CURL_TRC_WRITE(data, "looking for %s decoder: %.*s",
                     is_transfer ? "transfer" : "content", (int)namelen, name);
      is_chunked = (is_transfer && (namelen == 7) &&
                    strncasecompare(name, "chunked", 7));
      /* if we skip the decoding in this phase, do not look further.
       * Exception is "chunked" transfer-encoding which always must happen */
      if((is_transfer && !data->set.http_transfer_encoding && !is_chunked) ||
         (!is_transfer && data->set.http_ce_skip)) {
        /* not requested, ignore */
        CURL_TRC_WRITE(data, "decoder not requested, ignored: %.*s",
                       (int)namelen, name);
        return CURLE_OK;
      }

      if(Curl_cwriter_count(data, phase) + 1 >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to more than %u content encodings",
              MAX_ENCODE_STACK);
        return CURLE_BAD_CONTENT_ENCODING;
      }

      cwt = find_unencode_writer(name, namelen, phase);
      if(cwt && is_chunked && Curl_cwriter_get_by_type(data, cwt)) {
        /* A 'chunked' transfer encoding has already been added.
         * Ignore duplicates. See #13451.
         * Also RFC 9112, ch. 6.1:
         * "A sender MUST NOT apply the chunked transfer coding more than
         *  once to a message body."
         */
        CURL_TRC_WRITE(data, "ignoring duplicate 'chunked' decoder");
        return CURLE_OK;
      }

      if(is_transfer && !is_chunked &&
         Curl_cwriter_get_by_name(data, "chunked")) {
        /* RFC 9112, ch. 6.1:
         * "If any transfer coding other than chunked is applied to a
         *  response's content, the sender MUST either apply chunked as the
         *  final transfer coding or terminate the message by closing the
         *  connection."
         * "chunked" must be the last added to be the first in its phase,
         *  reject this.
         */
        failf(data, "Reject response due to 'chunked' not being the last "
              "Transfer-Encoding");
        return CURLE_BAD_CONTENT_ENCODING;
      }

      if(!cwt)
        cwt = &error_writer;  /* Defer error at use. */

      result = Curl_cwriter_create(&writer, data, cwt, phase);
      CURL_TRC_WRITE(data, "added %s decoder %s -> %d",
                     is_transfer ? "transfer" : "content", cwt->name, result);
      if(result)
        return result;

      result = Curl_cwriter_add(data, writer);
      if(result) {
        Curl_cwriter_free(data, writer);
        return result;
      }
    }
  } while(*enclist);

  return CURLE_OK;
}